

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileFeaturesCommand.cxx
# Opt level: O1

bool cmTargetCompileFeaturesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  bool bVar1;
  string local_70;
  cmTargetPropCommandBase local_50;
  
  cmTargetPropCommandBase::cmTargetPropCommandBase(&local_50,status);
  local_50._vptr_cmTargetPropCommandBase = (_func_int **)&PTR__cmTargetPropCommandBase_009ba320;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"COMPILE_FEATURES","");
  bVar1 = cmTargetPropCommandBase::HandleArguments(&local_50,args,&local_70,NO_FLAGS);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_50._vptr_cmTargetPropCommandBase = (_func_int **)&PTR__cmTargetPropCommandBase_009ba578;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.Property._M_dataplus._M_p != &local_50.Property.field_2) {
    operator_delete(local_50.Property._M_dataplus._M_p,
                    local_50.Property.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmTargetCompileFeaturesCommand(std::vector<std::string> const& args,
                                    cmExecutionStatus& status)
{
  return TargetCompileFeaturesImpl(status).HandleArguments(args,
                                                           "COMPILE_FEATURES");
}